

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

void Abc_NtkComputeFanoutInfo(Abc_Obj_t *pObj,float Slew)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  SC_Cell *p;
  float fVar2;
  undefined4 local_24;
  int iFanin;
  int i;
  Abc_Obj_t *pFanout;
  float Slew_local;
  Abc_Obj_t *pObj_local;
  
  for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_ObjFanout(pObj,local_24);
    iVar1 = Abc_ObjIsBarBuf(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsCo(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Abc_NodeFindFanin(pObj_00,pObj);
        fVar2 = Abc_NtkComputeEdgeDept(pObj_00,iVar1,Slew);
        Bus_SclObjSetETime(pObj_00,fVar2);
        p = Abc_SclObjCell(pObj_00);
        fVar2 = SC_CellPinCap(p,iVar1);
        Bus_SclObjSetCin(pObj_00,fVar2);
      }
    }
    else {
      fVar2 = Bus_SclObjDept(pObj_00);
      Bus_SclObjSetETime(pObj_00,fVar2);
      fVar2 = Bus_SclObjLoad(pObj_00);
      Bus_SclObjSetCin(pObj_00,fVar2);
    }
  }
  return;
}

Assistant:

void Abc_NtkComputeFanoutInfo( Abc_Obj_t * pObj, float Slew )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Abc_ObjIsBarBuf(pFanout) )
        {
            Bus_SclObjSetETime( pFanout, Bus_SclObjDept(pFanout) );
            Bus_SclObjSetCin( pFanout, Bus_SclObjLoad(pFanout) );
        }
        else if ( !Abc_ObjIsCo(pFanout) )
        {
            int iFanin = Abc_NodeFindFanin(pFanout, pObj);
            Bus_SclObjSetETime( pFanout, Abc_NtkComputeEdgeDept(pFanout, iFanin, Slew) );
            Bus_SclObjSetCin( pFanout, SC_CellPinCap( Abc_SclObjCell(pFanout), iFanin ) );
        }
    }
}